

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_8::DiskHandle::clone
          (DiskHandle *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Fault f;
  
  do {
    iVar1 = fcntl(*(int *)__fn,0x406,3);
    if (-1 < iVar1) goto LAB_004c0492;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 == 0) {
LAB_004c0492:
    (this->fd).fd = iVar1;
    UnwindDetector::UnwindDetector(&(this->fd).unwindDetector);
  }
  else {
    if ((iVar2 != 0x16) && (iVar2 != 0x5f)) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x11c,iVar2,"fnctl(fd, F_DUPFD_CLOEXEC, 3)","");
      kj::_::Debug::Fault::~Fault(&f);
    }
    do {
      iVar1 = dup(*(int *)__fn);
      if (-1 < iVar1) goto LAB_004c03a1;
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 != 0) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x123,iVar2,"fd2 = ::dup(fd)","");
      kj::_::Debug::Fault::fatal(&f);
    }
LAB_004c03a1:
    (this->fd).fd = iVar1;
    UnwindDetector::UnwindDetector(&(this->fd).unwindDetector);
    iVar1 = (this->fd).fd;
    do {
      iVar2 = ioctl(iVar1,0x5451);
      if (-1 < iVar2) goto LAB_004c04a1;
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 != 0) {
      if ((iVar2 != 0x16) && (iVar2 != 0x5f)) {
        kj::_::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x5e,iVar2,"ioctl(fd, FIOCLEX)","");
        kj::_::Debug::Fault::~Fault(&f);
      }
      do {
        uVar3 = fcntl(iVar1,1);
        if (-1 < (int)uVar3) goto LAB_004c0437;
        iVar2 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar2 == -1);
      if (iVar2 != 0) {
        kj::_::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6c,iVar2,"flags = fcntl(fd, F_GETFD)","");
        kj::_::Debug::Fault::fatal(&f);
      }
LAB_004c0437:
      if ((uVar3 & 1) == 0) {
        do {
          iVar2 = fcntl(iVar1,2,(ulong)(uVar3 | 1));
          if (-1 < iVar2) goto LAB_004c04a1;
          iVar2 = kj::_::Debug::getOsErrorNumber(false);
        } while (iVar2 == -1);
        if (iVar2 != 0) {
          kj::_::Debug::Fault::Fault
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x6e,iVar2,"fcntl(fd, F_SETFD, flags | FD_CLOEXEC)","");
          kj::_::Debug::Fault::fatal(&f);
        }
      }
    }
  }
LAB_004c04a1:
  return (int)this;
}

Assistant:

AutoCloseFd clone() const {
    int fd2;
#ifdef F_DUPFD_CLOEXEC
    KJ_SYSCALL_HANDLE_ERRORS(fd2 = fcntl(fd, F_DUPFD_CLOEXEC, 3)) {
      case EINVAL:
      case EOPNOTSUPP:
        // fall back
        break;
      default:
        KJ_FAIL_SYSCALL("fnctl(fd, F_DUPFD_CLOEXEC, 3)", error) { break; }
        break;
    } else {
      return AutoCloseFd(fd2);
    }
#endif

    KJ_SYSCALL(fd2 = ::dup(fd));
    AutoCloseFd result(fd2);
    setCloexec(result);
    return result;
  }